

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metro_exodus.cpp
# Opt level: O2

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::vertices
          (uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  int iVar1;
  _Base_ptr p_Var2;
  
  if (uGraph<std::__cxx11::string>::vertices()::vList_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&uGraph<std::__cxx11::string>::vertices()::vList_abi_cxx11_);
    if (iVar1 != 0) {
      uGraph<std::__cxx11::string>::vertices()::vList_abi_cxx11_.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev =
           (_List_node_base *)&uGraph<std::__cxx11::string>::vertices()::vList_abi_cxx11_;
      uGraph<std::__cxx11::string>::vertices()::vList_abi_cxx11_.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next =
           (_List_node_base *)&uGraph<std::__cxx11::string>::vertices()::vList_abi_cxx11_;
      uGraph<std::__cxx11::string>::vertices()::vList_abi_cxx11_.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size = 0;
      __cxa_atexit(std::__cxx11::
                   _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~_List_base,&uGraph<std::__cxx11::string>::vertices()::vList_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&uGraph<std::__cxx11::string>::vertices()::vList_abi_cxx11_);
    }
  }
  if (uGraph<std::__cxx11::string>::vertices()::vList_abi_cxx11_.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next ==
      (_List_node_base *)&uGraph<std::__cxx11::string>::vertices()::vList_abi_cxx11_) {
    for (p_Var2 = (this->adj)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->adj)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&uGraph<std::__cxx11::string>::vertices()::vList_abi_cxx11_,
                  (value_type *)(p_Var2 + 1));
    }
  }
  return &uGraph<std::__cxx11::string>::vertices()::vList_abi_cxx11_;
}

Assistant:

list<ver> &vertices() {
      static list<ver> vList;
      if (!vList.empty()) return vList;
      for (auto i = adj.begin(); i != adj.end(); ++i)
        vList.push_back(i->first);
      return vList;
    }